

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case0054(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Ty *pTVar2;
  Expectation *pEVar3;
  socklen_t __len;
  allocator<char> local_6b4;
  allocator<char> local_6b3;
  allocator<char> local_6b2;
  allocator<char> local_6b1;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650 [32];
  Expectation local_630;
  Expectation local_578;
  Decl local_4c0;
  Decl local_3f8;
  Decl local_330;
  Decl local_268;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_650,"void x ( int * * y , double * * z) ;",&local_6b1);
  Expectation::Expectation(&local_630);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"x",&local_6b2);
  pDVar1 = Decl::Function(&local_1a0,&local_670,File);
  pDVar1 = Ty::Void(&pDVar1->ty_,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Function,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Int_S,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  pTVar2 = Ty::addParam(&pDVar1->ty_);
  pDVar1 = Ty::Basic(pTVar2,Double,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  pTVar2 = Ty::atParam(&pDVar1->ty_);
  pDVar1 = Ty::Derived(pTVar2,Pointer,None,None);
  Decl::Decl(&local_d8,pDVar1);
  pEVar3 = Expectation::declaration(&local_630,&local_d8);
  Decl::Decl(&local_330);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"y",&local_6b3);
  pDVar1 = Decl::Object(&local_330,&local_690,ParameterDeclaration,FunctionPrototype);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_268,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_268);
  Decl::Decl(&local_4c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"z",&local_6b4);
  pDVar1 = Decl::Object(&local_4c0,&local_6b0,ParameterDeclaration,FunctionPrototype);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Double,None);
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  __len = 0;
  pDVar1 = Ty::Derived(&pDVar1->ty_,Pointer,None,None);
  Decl::Decl(&local_3f8,pDVar1);
  pEVar3 = Expectation::declaration(pEVar3,&local_3f8);
  Expectation::Expectation(&local_578,pEVar3);
  bind(this,(int)local_650,(sockaddr *)&local_578,__len);
  Expectation::~Expectation(&local_578);
  Decl::~Decl(&local_3f8);
  std::__cxx11::string::~string((string *)&local_6b0);
  Decl::~Decl(&local_4c0);
  Decl::~Decl(&local_268);
  std::__cxx11::string::~string((string *)&local_690);
  Decl::~Decl(&local_330);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_670);
  Decl::~Decl(&local_1a0);
  Expectation::~Expectation(&local_630);
  std::__cxx11::string::~string(local_650);
  return;
}

Assistant:

void DeclarationBinderTester::case0054()
{
    bind("void x ( int * * y , double * * z) ;",
         Expectation()
         .declaration(Decl()
                  .Function("x", ScopeKind::File)
                  .ty_.Void()
                  .ty_.Derived(TypeKind::Function)
                  .ty_.addParam().Basic(BasicTypeKind::Int_S)
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.addParam().Basic(BasicTypeKind::Double)
                  .ty_.atParam().Derived(TypeKind::Pointer)
                  .ty_.atParam().Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("y", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Basic(BasicTypeKind::Int_S)
                  .ty_.Derived(TypeKind::Pointer)
                  .ty_.Derived(TypeKind::Pointer))
         .declaration(Decl()
                  .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::FunctionPrototype)
                  .ty_.Basic(BasicTypeKind::Double)
                  .ty_.Derived(TypeKind::Pointer)
                  .ty_.Derived(TypeKind::Pointer)));
}